

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O1

Config * Config::load(Config *__return_storage_ptr__,string *file)

{
  ParseResult pr;
  ParseResult local_48;
  
  __return_storage_ptr__->ok = true;
  (__return_storage_ptr__->error)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).field_2;
  (__return_storage_ptr__->error)._M_string_length = 0;
  (__return_storage_ptr__->error).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->handlers).
  super__Vector_base<Config::Handler,_std::allocator<Config::Handler>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->handlers).
  super__Vector_base<Config::Handler,_std::allocator<Config::Handler>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->handlers).
  super__Vector_base<Config::Handler,_std::allocator<Config::Handler>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->json_)._M_h._M_buckets =
       &(__return_storage_ptr__->json_)._M_h._M_single_bucket;
  (__return_storage_ptr__->json_)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->json_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->json_)._M_h._M_element_count = 0;
  (__return_storage_ptr__->json_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->json_)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->json_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  toml::parseFile(&local_48,file);
  if (local_48.value.type_ == NULL_TYPE) {
    __return_storage_ptr__->ok = false;
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->error);
  }
  else {
    anon_unknown.dwarf_2cb70::loadHandlers(&local_48.value,__return_storage_ptr__);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.errorReason._M_dataplus._M_p != &local_48.errorReason.field_2) {
    operator_delete(local_48.errorReason._M_dataplus._M_p,
                    local_48.errorReason.field_2._M_allocated_capacity + 1);
  }
  toml::Value::~Value(&local_48.value);
  return __return_storage_ptr__;
}

Assistant:

Config Config::load(const std::string& file) {
  Config out;

  auto pr = toml::parseFile(file);
  if (!pr.valid()) {
    out.ok = false;
    out.error = pr.errorReason;
    return out;
  }

  try {
    loadHandlers(pr.value, out);
  } catch (std::runtime_error& e) {
    out.ok = false;
    out.error = e.what();
  }

  return out;
}